

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  Schema *pSVar1;
  Table *p_00;
  VTable *pVVar2;
  DbClientData *p_01;
  int iVar3;
  VTable *pVTab;
  HashElem *pHVar4;
  DbClientData *p;
  long lVar5;
  
  iVar3 = 0;
  if (db != (sqlite3 *)0x0) {
    iVar3 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar3 == 0) {
      iVar3 = 0x15;
      sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2c9fa,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if ((db->mTrace & 8) != 0) {
        (*(db->trace).xLegacy)((void *)0x8,(char *)db->pTraceArg);
      }
      if (db->noSharedCache == '\0') {
        btreeEnterAll(db);
      }
      if (0 < db->nDb) {
        lVar5 = 0;
        do {
          pSVar1 = db->aDb[lVar5].pSchema;
          if (pSVar1 != (Schema *)0x0) {
            for (pHVar4 = (pSVar1->tblHash).first; pHVar4 != (HashElem *)0x0; pHVar4 = pHVar4->next)
            {
              if (((Table *)pHVar4->data)->eTabType == '\x01') {
                sqlite3VtabDisconnect(db,(Table *)pHVar4->data);
              }
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < db->nDb);
      }
      for (pHVar4 = (db->aModule).first; pHVar4 != (HashElem *)0x0; pHVar4 = pHVar4->next) {
        p_00 = *(Table **)((long)pHVar4->data + 0x28);
        if (p_00 != (Table *)0x0) {
          sqlite3VtabDisconnect(db,p_00);
        }
      }
      pVTab = db->pDisconnect;
      if (pVTab != (VTable *)0x0) {
        db->pDisconnect = (VTable *)0x0;
        do {
          pVVar2 = pVTab->pNext;
          sqlite3VtabUnlock(pVTab);
          pVTab = pVVar2;
        } while (pVVar2 != (VTable *)0x0);
      }
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
      callFinaliser(db,0x88);
      if ((forceZombie == 0) && (iVar3 = connectionIsBusy(db), iVar3 != 0)) {
        sqlite3ErrorWithMsg(db,5,
                            "unable to close due to unfinalized statements or unfinished backups");
        if (db->mutex == (sqlite3_mutex *)0x0) {
          return 5;
        }
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        return 5;
      }
      while (p_01 = db->pDbData, p_01 != (DbClientData *)0x0) {
        db->pDbData = p_01->pNext;
        if (p_01->xDestructor != (_func_void_void_ptr *)0x0) {
          (*p_01->xDestructor)(p_01->pData);
        }
        sqlite3_free(p_01);
      }
      db->eOpenState = 0xa7;
      sqlite3LeaveMutexAndCloseZombie(db);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    /* EVIDENCE-OF: R-63257-11740 Calling sqlite3_close() or
    ** sqlite3_close_v2() with a NULL pointer argument is a harmless no-op. */
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mTrace & SQLITE_TRACE_CLOSE ){
    db->trace.xV2(SQLITE_TRACE_CLOSE, db->pTraceArg, db, 0);
  }

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3ErrorWithMsg(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  while( db->pDbData ){
    DbClientData *p = db->pDbData;
    db->pDbData = p->pNext;
    assert( p->pData!=0 );
    if( p->xDestructor ) p->xDestructor(p->pData);
    sqlite3_free(p);
  }

  /* Convert the connection into a zombie and then close it.
  */
  db->eOpenState = SQLITE_STATE_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}